

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O1

void __thiscall JPG::subsampling(JPG *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  MCU *pMVar5;
  Block *paiVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Block **ppaiVar11;
  uint uVar12;
  uint uVar13;
  uint componentID;
  uint ID;
  uint uVar14;
  int iVar15;
  uint x;
  uint uVar16;
  long lVar17;
  double dVar18;
  uint local_74;
  int local_70;
  int local_6c;
  long local_60;
  int *local_40;
  
  if (this->mcuHeight != 0) {
    uVar13 = 0;
    do {
      uVar7 = this->mcuWidth;
      if (uVar7 != 0) {
        uVar12 = 0;
        do {
          pMVar5 = this->data;
          bVar1 = this->maxVerticalSamplingFrequency;
          bVar2 = this->maxHorizontalSamplingFrequency;
          ID = 1;
          do {
            uVar8 = getVerticalSamplingFrequency(this,ID);
            if (uVar8 != 0) {
              local_74 = 0;
              local_70 = (uint)bVar1 * uVar13 * 8;
              do {
                uVar8 = getHorizontalSamplingFrequency(this,ID);
                if (uVar8 != 0) {
                  uVar16 = 0;
                  local_6c = bVar2 * uVar12 * 8;
                  do {
                    ppaiVar11 = MCU::operator[](pMVar5 + (uVar7 * uVar13 + uVar12),ID);
                    paiVar6 = *ppaiVar11;
                    uVar8 = getHorizontalSamplingFrequency(this,ID);
                    local_40 = paiVar6[uVar8 * local_74 + uVar16];
                    local_60 = 0;
                    do {
                      lVar17 = 0;
                      do {
                        bVar3 = this->maxVerticalSamplingFrequency;
                        uVar8 = getVerticalSamplingFrequency(this,ID);
                        iVar15 = 0;
                        bVar4 = this->maxHorizontalSamplingFrequency;
                        uVar9 = getHorizontalSamplingFrequency(this,ID);
                        uVar10 = ((uint)bVar4 * (int)lVar17) / uVar9 + local_6c;
                        if ((uVar10 < this->width) &&
                           (uVar14 = ((uint)bVar3 * (int)local_60) / uVar8 + local_70,
                           uVar14 < this->height)) {
                          dVar18 = YCbCr::operator[](this->BMPData + (this->width * uVar14 + uVar10)
                                                     ,ID);
                          iVar15 = (int)dVar18;
                        }
                        local_40[lVar17] = iVar15;
                        lVar17 = lVar17 + 1;
                      } while (lVar17 != 8);
                      local_60 = local_60 + 1;
                      local_40 = local_40 + 8;
                    } while (local_60 != 8);
                    uVar16 = uVar16 + 1;
                    local_6c = local_6c + 8;
                    uVar8 = getHorizontalSamplingFrequency(this,ID);
                  } while (uVar16 < uVar8);
                }
                local_74 = local_74 + 1;
                local_70 = local_70 + 8;
                uVar8 = getVerticalSamplingFrequency(this,ID);
              } while (local_74 < uVar8);
            }
            ID = ID + 1;
          } while (ID != 4);
          uVar12 = uVar12 + 1;
          uVar7 = this->mcuWidth;
        } while (uVar12 < uVar7);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < this->mcuHeight);
  }
  return;
}

Assistant:

void JPG::subsampling() {
    //遍历mcu
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            uint heightOffset = i * maxVerticalSamplingFrequency * 8;
            uint widthOffset = j * maxHorizontalSamplingFrequency * 8;
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0, yOffSet = heightOffset; ii < getVerticalSamplingFrequency(componentID); ii++, yOffSet = yOffSet + 8) {
                    for(uint jj = 0, xOffset = widthOffset; jj < getHorizontalSamplingFrequency(componentID); jj++, xOffset = xOffset + 8) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        //遍历Block every pixels 像素
                        for(uint y = 0; y < 8; y++) {
                            for(uint x = 0; x < 8; x++) {
                                uint sampledY = yOffSet + y *  maxVerticalSamplingFrequency / getVerticalSamplingFrequency(componentID);
                                uint sampledX = xOffset + x * maxHorizontalSamplingFrequency / getHorizontalSamplingFrequency(componentID);
                                //cannot find in original pictures;
                                if(sampledX >= width || sampledY >= height) {
                                    currentBlock[y * 8 + x] = 0;
                                } else {
                                    currentBlock[y * 8 + x] = BMPData[sampledY * width + sampledX][componentID];
                                }
                            }
                        }
                    }
                }             
            }
        }
    }  
}